

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O3

LY_ERR lys_compile_node(lysc_ctx *ctx,lysp_node *pnode,lysc_node *parent,uint16_t inherited_flags,
                       ly_set *child_set)

{
  ushort uVar1;
  uint32_t uVar2;
  uint uVar3;
  LY_ERR LVar4;
  lysc_node *node;
  char *format;
  ly_ctx *ctx_00;
  code *node_compile_spec;
  char *pcVar5;
  char *pcVar6;
  lys_module *parent_module;
  
  uVar2 = ctx->compile_opts;
  if (pnode->nodetype == 0x800) {
    parent_module = (lys_module *)0x0;
    lysc_update_path(ctx,(lys_module *)0x0,"{uses}");
  }
  else if (parent == (lysc_node *)0x0) {
    parent_module = (lys_module *)0x0;
  }
  else {
    parent_module = parent->module;
  }
  lysc_update_path(ctx,parent_module,pnode->name);
  uVar1 = pnode->nodetype;
  if (uVar1 < 0x60) {
    switch(uVar1) {
    case 1:
      node = (lysc_node *)calloc(1,0x78);
      node_compile_spec = lys_compile_node_container;
      break;
    case 2:
      node = (lysc_node *)calloc(1,0x68);
      node_compile_spec = lys_compile_node_choice;
      break;
    case 3:
    case 5:
    case 6:
    case 7:
switchD_00148d36_caseD_3:
      ly_log(ctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
             ,0x10d7);
      return LY_EINT;
    case 4:
      node = (lysc_node *)calloc(1,0x78);
      node_compile_spec = lys_compile_node_leaf;
      break;
    case 8:
      node = (lysc_node *)calloc(1,0x80);
      node_compile_spec = lys_compile_node_leaflist;
      break;
    default:
      if (uVar1 == 0x10) {
        node = (lysc_node *)calloc(1,0x88);
        node_compile_spec = lys_compile_node_list;
      }
      else {
        if (uVar1 != 0x20) goto switchD_00148d36_caseD_3;
LAB_00148dc8:
        node = (lysc_node *)calloc(1,0x60);
        node_compile_spec = lys_compile_node_any;
      }
    }
  }
  else if (uVar1 < 0x200) {
    if (uVar1 == 0x60) goto LAB_00148dc8;
    if (uVar1 != 0x80) {
      if (uVar1 != 0x100) goto switchD_00148d36_caseD_3;
      goto LAB_00148de3;
    }
    node = (lysc_node *)calloc(1,0x60);
    node_compile_spec = lys_compile_node_case;
  }
  else if (uVar1 == 0x200) {
LAB_00148de3:
    uVar3 = ctx->compile_opts;
    if ((uVar3 & 0x7000) != 0) {
      ctx_00 = ctx->ctx;
      pcVar5 = pnode->name;
      pcVar6 = "notification";
      if ((uVar3 >> 0xe & 1) == 0) {
        pcVar6 = "another RPC/action";
      }
      format = "Action \"%s\" is placed inside %s.";
LAB_00148ef1:
      ly_vlog(ctx_00,(char *)0x0,LYVE_SEMANTICS,format,pcVar5,pcVar6);
      return LY_EVALID;
    }
    node = (lysc_node *)calloc(1,0x118);
    ctx->compile_opts = uVar3 | 4;
    node_compile_spec = lys_compile_node_action;
  }
  else {
    if (uVar1 != 0x400) {
      if (uVar1 != 0x800) goto switchD_00148d36_caseD_3;
      LVar4 = lys_compile_uses(ctx,(lysp_node_uses *)pnode,parent,inherited_flags,child_set);
      lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
      goto LAB_00148f91;
    }
    uVar3 = ctx->compile_opts;
    if ((uVar3 & 0x7000) != 0) {
      ctx_00 = ctx->ctx;
      pcVar5 = pnode->name;
      pcVar6 = "another notification";
      if ((uVar3 >> 0xe & 1) == 0) {
        pcVar6 = "RPC/action";
      }
      format = "Notification \"%s\" is placed inside %s.";
      goto LAB_00148ef1;
    }
    node = (lysc_node *)calloc(1,0x68);
    ctx->compile_opts = uVar3 | 0x4004;
    node_compile_spec = lys_compile_node_notif;
  }
  if (node == (lysc_node *)0x0) {
    ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_node");
    return LY_EMEM;
  }
  LVar4 = lys_compile_node_(ctx,pnode,parent,inherited_flags,node_compile_spec,node,child_set);
  ctx->compile_opts = uVar2;
LAB_00148f91:
  lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
  return LVar4;
}

Assistant:

LY_ERR
lys_compile_node(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *parent, uint16_t inherited_flags,
        struct ly_set *child_set)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysc_node *node = NULL;
    uint32_t prev_opts = ctx->compile_opts;

    LY_ERR (*node_compile_spec)(struct lysc_ctx *, struct lysp_node *, struct lysc_node *);

    if (pnode->nodetype != LYS_USES) {
        lysc_update_path(ctx, parent ? parent->module : NULL, pnode->name);
    } else {
        lysc_update_path(ctx, NULL, "{uses}");
        lysc_update_path(ctx, NULL, pnode->name);
    }

    switch (pnode->nodetype) {
    case LYS_CONTAINER:
        node = (struct lysc_node *)calloc(1, sizeof(struct lysc_node_container));
        node_compile_spec = lys_compile_node_container;
        break;
    case LYS_LEAF:
        node = (struct lysc_node *)calloc(1, sizeof(struct lysc_node_leaf));
        node_compile_spec = lys_compile_node_leaf;
        break;
    case LYS_LIST:
        node = (struct lysc_node *)calloc(1, sizeof(struct lysc_node_list));
        node_compile_spec = lys_compile_node_list;
        break;
    case LYS_LEAFLIST:
        node = (struct lysc_node *)calloc(1, sizeof(struct lysc_node_leaflist));
        node_compile_spec = lys_compile_node_leaflist;
        break;
    case LYS_CHOICE:
        node = (struct lysc_node *)calloc(1, sizeof(struct lysc_node_choice));
        node_compile_spec = lys_compile_node_choice;
        break;
    case LYS_CASE:
        node = (struct lysc_node *)calloc(1, sizeof(struct lysc_node_case));
        node_compile_spec = lys_compile_node_case;
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        node = (struct lysc_node *)calloc(1, sizeof(struct lysc_node_anydata));
        node_compile_spec = lys_compile_node_any;
        break;
    case LYS_RPC:
    case LYS_ACTION:
        if (ctx->compile_opts & (LYS_IS_INPUT | LYS_IS_OUTPUT | LYS_IS_NOTIF)) {
            LOGVAL(ctx->ctx, LYVE_SEMANTICS,
                    "Action \"%s\" is placed inside %s.", pnode->name,
                    (ctx->compile_opts & LYS_IS_NOTIF) ? "notification" : "another RPC/action");
            return LY_EVALID;
        }
        node = (struct lysc_node *)calloc(1, sizeof(struct lysc_node_action));
        node_compile_spec = lys_compile_node_action;
        ctx->compile_opts |= LYS_COMPILE_NO_CONFIG;
        break;
    case LYS_NOTIF:
        if (ctx->compile_opts & (LYS_IS_INPUT | LYS_IS_OUTPUT | LYS_IS_NOTIF)) {
            LOGVAL(ctx->ctx, LYVE_SEMANTICS,
                    "Notification \"%s\" is placed inside %s.", pnode->name,
                    (ctx->compile_opts & LYS_IS_NOTIF) ? "another notification" : "RPC/action");
            return LY_EVALID;
        }
        node = (struct lysc_node *)calloc(1, sizeof(struct lysc_node_notif));
        node_compile_spec = lys_compile_node_notif;
        ctx->compile_opts |= LYS_COMPILE_NOTIFICATION;
        break;
    case LYS_USES:
        ret = lys_compile_uses(ctx, (struct lysp_node_uses *)pnode, parent, inherited_flags, child_set);
        lysc_update_path(ctx, NULL, NULL);
        lysc_update_path(ctx, NULL, NULL);
        return ret;
    default:
        LOGINT(ctx->ctx);
        return LY_EINT;
    }
    LY_CHECK_ERR_RET(!node, LOGMEM(ctx->ctx), LY_EMEM);

    ret = lys_compile_node_(ctx, pnode, parent, inherited_flags, node_compile_spec, node, child_set);

    ctx->compile_opts = prev_opts;
    lysc_update_path(ctx, NULL, NULL);
    return ret;
}